

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseProtoKey(Parser *this)

{
  bool bVar1;
  int t;
  Parser *in_RSI;
  Parser *this_local;
  CheckedError *ce;
  
  t = (int)in_RSI;
  if ((in_RSI->super_ParserState).token_ == 0x28) {
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      while( true ) {
        bVar1 = true;
        if ((in_RSI->super_ParserState).token_ != 0x2e) {
          bVar1 = (in_RSI->super_ParserState).token_ == 0x104;
        }
        if (!bVar1) break;
        Next(this);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) goto LAB_0012c543;
        CheckedError::~CheckedError((CheckedError *)this);
      }
      Expect(this,t);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (!bVar1) {
        CheckedError::~CheckedError((CheckedError *)this);
        goto LAB_0012c3bd;
      }
    }
  }
  else {
    Expect(this,t);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
LAB_0012c53a:
      anon_unknown_0::NoError();
    }
  }
LAB_0012c543:
  return SUB82(this,0);
LAB_0012c3bd:
  bVar1 = Is(in_RSI,0x2e);
  if (!bVar1) goto LAB_0012c53a;
  Next(this);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (bVar1) goto LAB_0012c543;
  CheckedError::~CheckedError((CheckedError *)this);
  Expect(this,t);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (bVar1) goto LAB_0012c543;
  CheckedError::~CheckedError((CheckedError *)this);
  goto LAB_0012c3bd;
}

Assistant:

CheckedError Parser::ParseProtoKey() {
  if (token_ == '(') {
    NEXT();
    // Skip "(a.b)" style custom attributes.
    while (token_ == '.' || token_ == kTokenIdentifier) NEXT();
    EXPECT(')');
    while (Is('.')) {
      NEXT();
      EXPECT(kTokenIdentifier);
    }
  } else {
    EXPECT(kTokenIdentifier);
  }
  return NoError();
}